

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewEdgeCalculator.cpp
# Opt level: O1

bool __thiscall
NewEdgeCalculator::checkGaps
          (NewEdgeCalculator *this,
          vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> *cov_ap1,
          vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> *cov_ap2,
          vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *aub)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  pointer ppVar4;
  pointer pmVar5;
  pointer pmVar6;
  bool bVar7;
  bool bVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  
  ppVar4 = (aub->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  uVar9 = (int)((ulong)((long)(aub->
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar4) >> 3) - 1;
  pmVar5 = (cov_ap1->
           super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pmVar6 = (cov_ap2->
           super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar11 = 0;
  uVar1 = 0;
  if (0 < (int)uVar9) {
    uVar11 = (ulong)uVar9;
  }
  while (uVar10 = uVar1, uVar11 != uVar10) {
    iVar2 = ppVar4[uVar10].first;
    iVar3 = ppVar4[uVar10 + 1].first;
    iVar14 = pmVar5[iVar3].ref - pmVar5[iVar2].ref;
    iVar12 = pmVar5[iVar3].pir - pmVar5[iVar2].pir;
    iVar13 = pmVar6[ppVar4[uVar10 + 1].second].pir - pmVar6[ppVar4[uVar10].second].pir;
    bVar7 = pmVar6[ppVar4[uVar10].second].read == pmVar6[ppVar4[uVar10 + 1].second].read;
    bVar8 = pmVar5[iVar3].read == pmVar5[iVar2].read;
    if ((((iVar14 == 1) && (iVar12 != iVar13)) && (bVar7 && bVar8)) ||
       (((1 < iVar14 && iVar12 != iVar13) && (bVar7 && bVar8) ||
        (((uVar1 = uVar10 + 1, 1 < iVar14 && (1 < iVar12)) && (iVar12 == iVar13)))))) break;
  }
  return (long)(int)uVar9 <= (long)uVar10;
}

Assistant:

bool NewEdgeCalculator::checkGaps(const std::vector<AlignmentRecord::mapValue> & cov_ap1,const std::vector<AlignmentRecord::mapValue> & cov_ap2,const std::vector<std::pair<int,int>> & aub) const{
    //int num_inserts=0;
    for (int i = 0; i < (signed)aub.size()-1; ++i){
        auto& cov_ap1_i = cov_ap1[aub[i].first];
        auto& cov_ap1_i1 = cov_ap1[aub[i+1].first];
        auto& cov_ap2_i = cov_ap2[aub[i].second];
        auto& cov_ap2_i1 = cov_ap2[aub[i+1].second];

        int ref_diff = cov_ap1_i1.ref-cov_ap1_i.ref;
        int pos_diff1 = cov_ap1_i1.pir-cov_ap1_i.pir; //<0 if jump is given
        int pos_diff2 = cov_ap2_i1.pir-cov_ap2_i.pir; //<0 if jump is given
        bool jump1 = cov_ap1_i1.read-cov_ap1_i.read; //=0/1 for no jump/jump
        bool jump2 = cov_ap2_i1.read-cov_ap2_i.read;
        //insertion
        if(ref_diff == 1 && pos_diff1 != pos_diff2 && (jump1 || jump2) == 0){
            /*if(num_inserts == 0) num_inserts+= pos_diff1-pos_diff2;
            else*/ return false;
        }
        //deletion
        else if(ref_diff > 1 && pos_diff1 != pos_diff2 && (jump1 || jump2) == 0){
            return false;
        }
        else if(ref_diff > 1 && pos_diff1 == pos_diff2 && pos_diff1 > 1){
            return false;
        }
    }
    return true;
}